

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::TexturePool::release(TexturePool *this,GLuint id)

{
  iterator __position;
  GLuint local_c [2];
  GLuint id_local;
  
  local_c[0] = id;
  if (id != 0) {
    __position._M_current =
         (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,local_c);
    }
    else {
      *__position._M_current = id;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  __assert_fail("id > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                ,0x3d,"void rengine::OpenGLRenderer::TexturePool::release(GLuint)");
}

Assistant:

void release(GLuint id) {
            assert(id > 0);
            push_back(id);
        }